

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O2

void __thiscall
OpenMesh::ArrayKernel::resize(ArrayKernel *this,size_t _n_vertices,size_t _n_edges,size_t _n_faces)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  std::vector<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>::resize
            (&this->vertices_,_n_vertices);
  std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::resize
            (&this->edges_,_n_edges);
  std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::resize
            (&this->faces_,_n_faces);
  iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[2])(this);
  PropertyContainer::resize(&(this->super_BaseKernel).vprops_,CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[3])(this);
  PropertyContainer::resize(&(this->super_BaseKernel).hprops_,CONCAT44(extraout_var_00,iVar1));
  iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[4])(this);
  PropertyContainer::resize(&(this->super_BaseKernel).eprops_,CONCAT44(extraout_var_01,iVar1));
  iVar1 = (*(this->super_BaseKernel)._vptr_BaseKernel[5])(this);
  PropertyContainer::resize(&(this->super_BaseKernel).fprops_,CONCAT44(extraout_var_02,iVar1));
  return;
}

Assistant:

void ArrayKernel::resize( size_t _n_vertices, size_t _n_edges, size_t _n_faces )
{
  vertices_.resize(_n_vertices);
  edges_.resize(_n_edges);
  faces_.resize(_n_faces);

  vprops_resize(n_vertices());
  hprops_resize(n_halfedges());
  eprops_resize(n_edges());
  fprops_resize(n_faces());
}